

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.hpp
# Opt level: O2

lane<std::complex<float>_> *
re::simd::lane_transform<std::complex<float>,re::simd::intrinsics::mul<std::complex<float>>>
          (long a,undefined8 b,lane<std::complex<float>_> *output)

{
  std::
  transform<std::complex<float>const*,std::complex<float>const*,std::complex<float>*,re::simd::intrinsics::mul<std::complex<float>>>
            (a,a + 8,b,output);
  return output;
}

Assistant:

lane<T>& lane_transform(
    lane<T> const& a,
    lane<T> const& b,
    lane<T>& output,
    BinaryOp op
) {
    std::transform(
        std::cbegin(a.a),
        std::cend(a.a),
        std::cbegin(b.a),
        std::begin(output.a),
        op
    );
    return output;
}